

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O1

bool __thiscall
Assimp::IFC::TryQueryMeshCache
          (IFC *this,IfcRepresentationItem *item,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *mesh_indices,
          uint mat_index,ConversionData *conv)

{
  iterator iVar1;
  undefined4 in_register_0000000c;
  _Base_ptr p_Var2;
  insert_iterator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  __result;
  MeshCacheIndex idx;
  key_type local_28;
  
  local_28.matindex = (uint)mesh_indices;
  local_28.item = (IfcRepresentationItem *)this;
  iVar1 = std::
          _Rb_tree<Assimp::IFC::ConversionData::MeshCacheIndex,_std::pair<const_Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<Assimp::IFC::ConversionData::MeshCacheIndex>,_std::allocator<std::pair<const_Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
          ::find((_Rb_tree<Assimp::IFC::ConversionData::MeshCacheIndex,_std::pair<const_Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<Assimp::IFC::ConversionData::MeshCacheIndex>,_std::allocator<std::pair<const_Assimp::IFC::ConversionData::MeshCacheIndex,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                  *)(CONCAT44(in_register_0000000c,mat_index) + 0xe0),&local_28);
  p_Var2 = (_Base_ptr)(CONCAT44(in_register_0000000c,mat_index) + 0xe8);
  if (iVar1._M_node != p_Var2) {
    __result.iter._M_node = (_Base_ptr)conv;
    __result.container =
         (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
         &(item->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>).field_0x8;
    std::__copy_move<false,false,std::bidirectional_iterator_tag>::
    __copy_m<std::_Rb_tree_const_iterator<unsigned_int>,std::insert_iterator<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>
              ((__copy_move<false,false,std::bidirectional_iterator_tag> *)
               iVar1._M_node[2]._M_parent,
               (_Rb_tree_const_iterator<unsigned_int>)&iVar1._M_node[1]._M_right,
               (_Rb_tree_const_iterator<unsigned_int>)item,__result);
  }
  return iVar1._M_node != p_Var2;
}

Assistant:

bool TryQueryMeshCache(const Schema_2x3::IfcRepresentationItem& item,
    std::set<unsigned int>& mesh_indices, unsigned int mat_index,
    ConversionData& conv)
{
    ConversionData::MeshCacheIndex idx(&item, mat_index);
    ConversionData::MeshCache::const_iterator it = conv.cached_meshes.find(idx);
    if (it != conv.cached_meshes.end()) {
        std::copy((*it).second.begin(),(*it).second.end(),std::inserter(mesh_indices, mesh_indices.end()));
        return true;
    }
    return false;
}